

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O0

bool __thiscall
bssl::ssl_parse_extensions
          (bssl *this,CBS *cbs,uint8_t *out_alert,initializer_list<bssl::SSLExtension_*> extensions,
          bool ignore_unknown)

{
  SSLExtension *pSVar1;
  int iVar2;
  const_iterator ppSVar3;
  size_t sVar4;
  SSLExtension *ext_1;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bssl::SSLExtension_*> *__range2;
  SSLExtension *found;
  CBS data;
  undefined1 auStack_68 [6];
  uint16_t type;
  CBS copy;
  SSLExtension *ext;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<bssl::SSLExtension_*> *__range1;
  bool ignore_unknown_local;
  uint8_t *out_alert_local;
  CBS *cbs_local;
  initializer_list<bssl::SSLExtension_*> extensions_local;
  
  extensions_local._M_array = extensions._M_array;
  cbs_local = (CBS *)out_alert;
  __end1 = std::initializer_list<bssl::SSLExtension_*>::begin
                     ((initializer_list<bssl::SSLExtension_*> *)&cbs_local);
  ppSVar3 = std::initializer_list<bssl::SSLExtension_*>::end
                      ((initializer_list<bssl::SSLExtension_*> *)&cbs_local);
  while( true ) {
    if (__end1 == ppSVar3) {
      _auStack_68 = *(uint8_t **)this;
      copy.data = *(uint8_t **)(this + 8);
      while( true ) {
        sVar4 = CBS_len((CBS *)auStack_68);
        if (sVar4 == 0) {
          return true;
        }
        iVar2 = CBS_get_u16((CBS *)auStack_68,(uint16_t *)((long)&data.len + 6));
        if ((iVar2 == 0) ||
           (iVar2 = CBS_get_u16_length_prefixed((CBS *)auStack_68,(CBS *)&found), iVar2 == 0))
        break;
        __range2 = (initializer_list<bssl::SSLExtension_*> *)0x0;
        __end2 = std::initializer_list<bssl::SSLExtension_*>::begin
                           ((initializer_list<bssl::SSLExtension_*> *)&cbs_local);
        ppSVar3 = std::initializer_list<bssl::SSLExtension_*>::end
                            ((initializer_list<bssl::SSLExtension_*> *)&cbs_local);
        while ((pSVar1 = (SSLExtension *)__range2, __end2 != ppSVar3 &&
               ((pSVar1 = *__end2, data.len._6_2_ != pSVar1->type || ((pSVar1->allowed & 1U) == 0)))
               )) {
          __end2 = __end2 + 1;
        }
        __range2 = (initializer_list<bssl::SSLExtension_*> *)pSVar1;
        if (__range2 == (initializer_list<bssl::SSLExtension_*> *)0x0) {
          if (((undefined1  [16])extensions & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            ERR_put_error(0x10,0,0xde,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                          ,0xd0);
            ERR_add_error_dataf("extension %u",(ulong)data.len._6_2_);
            *(undefined1 *)&cbs->data = 0x6e;
            return false;
          }
        }
        else {
          if (((ulong)__range2->_M_array & 0x1000000) != 0) {
            ERR_put_error(0x10,0,0x101,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                          ,0xd8);
            *(undefined1 *)&cbs->data = 0x2f;
            return false;
          }
          *(undefined1 *)((long)&__range2->_M_array + 3) = 1;
          __range2->_M_len = (size_type)found;
          __range2[1]._M_array = (iterator)data.data;
        }
      }
      ERR_put_error(0x10,0,0xbe,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                    ,0xbf);
      *(undefined1 *)&cbs->data = 0x32;
      return false;
    }
    copy.len = (size_t)*__end1;
    ((SSLExtension *)copy.len)->present = false;
    CBS_init(&((SSLExtension *)copy.len)->data,(uint8_t *)0x0,0);
    if (((*(byte *)(copy.len + 2) & 1) == 0) && ((((byte)extensions._M_len & 1 ^ 0xff) & 1) == 0))
    break;
    __end1 = __end1 + 1;
  }
  __assert_fail("!ignore_unknown",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                ,0xb5,
                "bool bssl::ssl_parse_extensions(const CBS *, uint8_t *, std::initializer_list<SSLExtension *>, bool)"
               );
}

Assistant:

bool ssl_parse_extensions(const CBS *cbs, uint8_t *out_alert,
                          std::initializer_list<SSLExtension *> extensions,
                          bool ignore_unknown) {
  // Reset everything.
  for (SSLExtension *ext : extensions) {
    ext->present = false;
    CBS_init(&ext->data, nullptr, 0);
    if (!ext->allowed) {
      assert(!ignore_unknown);
    }
  }

  CBS copy = *cbs;
  while (CBS_len(&copy) != 0) {
    uint16_t type;
    CBS data;
    if (!CBS_get_u16(&copy, &type) ||
        !CBS_get_u16_length_prefixed(&copy, &data)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_PARSE_TLSEXT);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    SSLExtension *found = nullptr;
    for (SSLExtension *ext : extensions) {
      if (type == ext->type && ext->allowed) {
        found = ext;
        break;
      }
    }

    if (found == nullptr) {
      if (ignore_unknown) {
        continue;
      }
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
      ERR_add_error_dataf("extension %u", unsigned{type});
      *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
      return false;
    }

    // Duplicate ext_types are forbidden.
    if (found->present) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DUPLICATE_EXTENSION);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }

    found->present = true;
    found->data = data;
  }

  return true;
}